

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_val_t *
gs_c_fn_signature(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals,
                 gs_val_type *types,int num_types)

{
  vec2 vVar1;
  _Bool _Var2;
  undefined3 uVar3;
  ulong uVar4;
  gs_val_t local_48;
  
  if (num_types == num_vals) {
    if (0 < num_types) {
      uVar4 = 0;
      do {
        gs_eval_cast(&local_48,eval,*vals,types[uVar4]);
        *(undefined8 *)((long)&vals->field_2 + 8) = local_48.field_2._8_8_;
        vals->type = local_48.type;
        vals->is_return = local_48.is_return;
        *(undefined3 *)&vals->field_0x5 = local_48._5_3_;
        (vals->field_2).vec2_val = local_48.field_2.vec2_val;
        if (vals->is_return == true) {
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
               *(undefined8 *)((long)&vals->field_2 + 8);
          _Var2 = vals->is_return;
          uVar3 = *(undefined3 *)&vals->field_0x5;
          vVar1 = (vals->field_2).vec2_val;
          __return_storage_ptr__->type = vals->type;
          __return_storage_ptr__->is_return = _Var2;
          *(undefined3 *)&__return_storage_ptr__->field_0x5 = uVar3;
          (__return_storage_ptr__->field_2).vec2_val = vVar1;
          return __return_storage_ptr__;
        }
        uVar4 = uVar4 + 1;
        vals = vals + 1;
      } while ((uint)num_types != uVar4);
    }
    __return_storage_ptr__->type = GS_VAL_INT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).int_val = 0;
  }
  else {
    gs_val_error(__return_storage_ptr__,"Wrong num of args to function");
  }
  return __return_storage_ptr__;
}

Assistant:

gs_val_t gs_c_fn_signature(gs_eval_t *eval, gs_val_t *vals, int num_vals, gs_val_type *types, int num_types) {
    if (num_types != num_vals) {
        return gs_val_error("Wrong num of args to function");
    }

    for (int i = 0; i < num_types; i++) {
        vals[i] = gs_eval_cast(eval, vals[i], types[i]);
        if (vals[i].is_return) return vals[i];
    }

    return gs_val_int(0);
}